

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

void base64_encode_tail_using_maps(base64_maps_t *maps,char *dest,char *src,size_t srclen)

{
  ulong in_RAX;
  char longsrc [3];
  ulong uStack_28;
  
  uStack_28 = in_RAX & 0xff000000ffffffff;
  if (srclen < 4) {
    memcpy(longsrc,src,srclen);
    base64_encode_triplet_using_maps(maps,dest,longsrc);
    memset(dest + srclen + 1,0x3d,3 - srclen);
    return;
  }
  __assert_fail("srclen <= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/libwally-core/src/ccan/ccan/base64/base64.c"
                ,0x51,
                "void base64_encode_tail_using_maps(const base64_maps_t *, char *, const char *, const size_t)"
               );
}

Assistant:

void base64_encode_tail_using_maps(const base64_maps_t *maps, char dest[4],
				   const char *src, const size_t srclen)
{
	char longsrc[3] = { 0 };

	assert(srclen <= 3);

	memcpy(longsrc, src, srclen);
	base64_encode_triplet_using_maps(maps, dest, longsrc);
	memset(dest+1+srclen, '=', 3-srclen);
}